

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

string * __thiscall
pbrt::MixMaterial::ToString_abi_cxx11_(string *__return_storage_ptr__,MixMaterial *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::MaterialHandle_const&,pbrt::MaterialHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,"[ MixMaterial materials: [ %s %s ] amount: %s ]",
             this->materials,this->materials + 1,&this->amount);
  return __return_storage_ptr__;
}

Assistant:

std::string MixMaterial::ToString() const {
    return StringPrintf("[ MixMaterial materials: [ %s %s ] amount: %s ]", materials[0],
                        materials[1], amount);
}